

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O1

QRgba64 * fetchRGBA16FToRGBA64PM_avx2
                    (QRgba64 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                    QDitherInfo *param_6)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  
  uVar5 = 0;
  if (1 < count) {
    uVar4 = 0;
    do {
      auVar10 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src + uVar4 * 8 + (long)index * 8));
      auVar2 = vshufps_avx(auVar10,auVar10,0xff);
      auVar3._4_4_ = auVar2._4_4_ * auVar10._4_4_;
      auVar3._0_4_ = auVar2._0_4_ * auVar10._0_4_;
      auVar3._8_4_ = auVar2._8_4_ * auVar10._8_4_;
      auVar3._12_4_ = auVar2._12_4_ * auVar10._12_4_;
      auVar3._16_4_ = auVar2._16_4_ * auVar10._16_4_;
      auVar3._20_4_ = auVar2._20_4_ * auVar10._20_4_;
      auVar3._24_4_ = auVar2._24_4_ * auVar10._24_4_;
      auVar3._28_4_ = auVar2._28_4_;
      auVar2 = vblendps_avx(auVar3,auVar10,0x88);
      auVar9._0_4_ = (int)(auVar2._0_4_ * 65535.0 + 0.5);
      auVar9._4_4_ = (int)(auVar2._4_4_ * 65535.0 + 0.5);
      auVar9._8_4_ = (int)(auVar2._8_4_ * 65535.0 + 0.5);
      auVar9._12_4_ = (int)(auVar2._12_4_ * 65535.0 + 0.5);
      auVar10._16_4_ = (int)(auVar2._16_4_ * 65535.0 + 0.5);
      auVar10._0_16_ = auVar9;
      auVar10._20_4_ = (int)(auVar2._20_4_ * 65535.0 + 0.5);
      auVar10._24_4_ = (int)(auVar2._24_4_ * 65535.0 + 0.5);
      auVar10._28_4_ = (int)(auVar2._28_4_ + 0.5);
      auVar9 = vpackusdw_avx(auVar9,auVar10._16_16_);
      *(undefined1 (*) [16])(buffer + uVar4) = auVar9;
      uVar5 = uVar4 + 2;
      uVar6 = uVar4 + 3;
      uVar4 = uVar5;
    } while (uVar6 < (uint)count);
  }
  if ((int)uVar5 < count) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(src + (uVar5 & 0xffffffff) * 8 + (long)index * 8);
    auVar1 = vcvtph2ps_f16c(auVar1);
    auVar9 = vshufps_avx(auVar1,auVar1,0xff);
    auVar8._0_4_ = auVar9._0_4_ * auVar1._0_4_;
    auVar8._4_4_ = auVar9._4_4_ * auVar1._4_4_;
    auVar8._8_4_ = auVar9._8_4_ * auVar1._8_4_;
    auVar8._12_4_ = auVar9._12_4_ * auVar1._12_4_;
    auVar9 = vblendps_avx(auVar8,auVar1,8);
    auVar7._0_4_ = (int)(auVar9._0_4_ * 65535.0 + 0.5);
    auVar7._4_4_ = (int)(auVar9._4_4_ * 65535.0 + 0.5);
    auVar7._8_4_ = (int)(auVar9._8_4_ * 65535.0 + 0.5);
    auVar7._12_4_ = (int)(auVar9._12_4_ * 65535.0 + 0.5);
    auVar9 = vpackusdw_avx(auVar7,auVar7);
    buffer[uVar5 & 0xffffffff].rgba = auVar9._0_8_;
  }
  return buffer;
}

Assistant:

const QRgba64 *QT_FASTCALL fetchRGBA16FToRGBA64PM_avx2(QRgba64 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    const quint64 *s = reinterpret_cast<const quint64 *>(src) + index;
    const __m256 vf = _mm256_set1_ps(65535.0f);
    const __m256 vh = _mm256_set1_ps(0.5f);
    int i = 0;
    for (; i + 1 < count; i += 2) {
        __m256 vsf = _mm256_cvtph_ps(_mm_loadu_si128((const __m128i *)(s + i)));
        __m256 vsa = _mm256_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm256_mul_ps(vsf, vsa);
        vsf = _mm256_blend_ps(vsf, vsa, 0x88);
        vsf = _mm256_mul_ps(vsf, vf);
        vsf = _mm256_add_ps(vsf, vh);
        __m256i vsi = _mm256_cvttps_epi32(vsf);
        vsi = _mm256_packus_epi32(vsi, vsi);
        vsi = _mm256_permute4x64_epi64(vsi, _MM_SHUFFLE(3, 1, 2, 0));
        _mm_storeu_si128((__m128i *)(buffer + i), _mm256_castsi256_si128(vsi));
    }
    if (i < count) {
        __m128 vsf = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i *)(s + i)));
        __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm_mul_ps(vsf, vsa);
        vsf = _mm_insert_ps(vsf, vsa, 0x30);
        vsf = _mm_mul_ps(vsf, _mm_set1_ps(65535.0f));
        vsf = _mm_add_ps(vsf, _mm_set1_ps(0.5f));
        __m128i vsi = _mm_cvttps_epi32(vsf);
        vsi = _mm_packus_epi32(vsi, vsi);
        _mm_storel_epi64((__m128i *)(buffer + i), vsi);
    }
    return buffer;
}